

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::SyncToSetAndConsumeInst<true>::Exec
          (SyncToSetAndConsumeInst<true> *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  Char CVar1;
  bool bVar2;
  uint uVar3;
  CharCount CVar4;
  Type pRVar5;
  
  pRVar5 = matcher->stats;
  if (pRVar5 != (Type)0x0) {
    pRVar5->numCompares = pRVar5->numCompares + 1;
  }
  uVar3 = *inputOffset;
  if (uVar3 < inputLength) {
    do {
      CVar1 = input[uVar3];
      if ((ushort)CVar1 < 0x100) {
        if (((this->super_SetMixin<true>).set.direct.vec[(ushort)CVar1 >> 5] >>
             ((ushort)CVar1 & 0x1f) & 1) == 0) break;
      }
      else {
        if ((this->super_SetMixin<true>).set.root == (CharSetNode *)0x0) break;
        bVar2 = RuntimeCharSet<char16_t>::Get_helper
                          (&(this->super_SetMixin<true>).set,(uint)(ushort)CVar1);
        if (!bVar2) {
          uVar3 = *inputOffset;
          break;
        }
        pRVar5 = matcher->stats;
      }
      if (pRVar5 != (Type)0x0) {
        pRVar5->numCompares = pRVar5->numCompares + 1;
      }
      uVar3 = *inputOffset + 1;
      *inputOffset = uVar3;
    } while (uVar3 < inputLength);
  }
  CVar4 = inputLength;
  if (uVar3 < inputLength) {
    *inputOffset = uVar3 + 1;
    *instPointer = *instPointer + 0x29;
    CVar4 = uVar3;
  }
  *matchStart = CVar4;
  return inputLength <= uVar3;
}

Assistant:

inline bool SyncToSetAndConsumeInst<IsNegation>::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        const RuntimeCharSet<Char>& matchSet = this->set;
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        while (inputOffset < inputLength && matchSet.Get(input[inputOffset]) == IsNegation)
        {
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.CompStats();
#endif
            inputOffset++;
        }

        if (inputOffset >= inputLength)
        {
            return matcher.HardFail(HARDFAIL_PARAMETERS(HardFailMode::ImmediateFail));
        }

        matchStart = inputOffset++;
        instPointer += sizeof(*this);
        return false;
    }